

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFStream.cpp
# Opt level: O0

void __thiscall
adios2::transport::FileFStream::SetBuffer(FileFStream *this,char *buffer,size_t size)

{
  char *pcVar1;
  long in_RDX;
  long in_RSI;
  allocator *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  string local_108 [24];
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  string *in_stack_ffffffffffffff18;
  string *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff30;
  allocator local_c1;
  string local_c0 [39];
  allocator<char> local_99;
  string *in_stack_ffffffffffffff68;
  FileFStream *in_stack_ffffffffffffff70;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [40];
  long local_10;
  
  local_10 = in_RSI;
  if ((in_RSI == 0) && (in_RDX != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"Toolkit",&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"transport::file::FileFStream",&local_71);
    in_stack_fffffffffffffed8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_99;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff68,"SetBuffer",(allocator *)in_stack_fffffffffffffed8
              );
    in_stack_fffffffffffffed0 = &local_c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_c0,"buffer size must be 0 when using a NULL buffer",in_stack_fffffffffffffed0);
    helper::Throw<std::invalid_argument>
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
               in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
    std::allocator<char>::~allocator(&local_99);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  pcVar1 = (char *)std::fstream::rdbuf();
  std::streambuf::pubsetbuf(pcVar1,local_10);
  std::operator+((char *)in_stack_ffffffffffffff18,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  std::operator+(in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0);
  CheckFile(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff18);
  std::__cxx11::string::~string(local_108);
  return;
}

Assistant:

void FileFStream::SetBuffer(char *buffer, size_t size)
{
    if (!buffer && size != 0)
    {
        helper::Throw<std::invalid_argument>("Toolkit", "transport::file::FileFStream", "SetBuffer",
                                             "buffer size must be 0 when using a NULL buffer");
    }
    m_FileStream.rdbuf()->pubsetbuf(buffer, size);
    CheckFile("couldn't set buffer in file " + m_Name + ", in call to fstream rdbuf()->pubsetbuf");
}